

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_msg_header_trim_u16(nng_msg *msg,uint16_t *val)

{
  int iVar1;
  ushort *puVar2;
  size_t sVar3;
  
  puVar2 = (ushort *)nni_msg_header(msg);
  sVar3 = nni_msg_header_len(msg);
  iVar1 = 3;
  if (1 < sVar3) {
    *val = *puVar2 << 8 | *puVar2 >> 8;
    nni_msg_header_trim(msg,2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_msg_header_trim_u16(nng_msg *msg, uint16_t *val)
{
	uint8_t *header = nni_msg_header(msg);
	uint16_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	NNI_GET16(header, v);
	*val = v;
	nni_msg_header_trim(msg, sizeof(v));
	return (0);
}